

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffs.c
# Opt level: O3

int handle_subfield(FFSBuffer buf,FMFormat_conflict f,estate s,size_t data_offset,
                   size_t parent_offset,FMTypeDesc *t)

{
  FMTypeEnum FVar1;
  void *pvVar2;
  internal_iovec *piVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  cod_exec_context pcVar6;
  uint tmp;
  int iVar7;
  size_t sVar8;
  field_marshal_info_conflict pfVar9;
  size_t sVar10;
  addr_list_entry *paVar11;
  FMTypeDesc *pFVar12;
  ulong *puVar13;
  FMFormat_conflict *extraout_RDX;
  FMFormat_conflict *data;
  uint uVar14;
  FMTypeDesc *next;
  FFSBuffer buf_00;
  long lVar15;
  void *unaff_R13;
  ulong uVar16;
  long lVar17;
  size_t tmp_data_loc;
  subsample_marshal_data smd;
  size_t local_98;
  size_t local_90;
  void *local_88;
  undefined8 local_80;
  cod_exec_context local_78;
  field_marshal_info_conflict local_70;
  size_t local_68;
  size_t local_60;
  undefined4 local_58 [2];
  size_t local_50;
  void *local_48;
  long local_40;
  int local_38;
  
  switch(t->type) {
  case FMType_pointer:
    uVar14 = f->pointer_size - 1;
    uVar16 = (ulong)uVar14;
    if (uVar14 < 8) {
      pvVar2 = buf->tmp_buffer;
      switch(uVar16) {
      case 0:
        unaff_R13 = (void *)(ulong)*(byte *)((long)pvVar2 + data_offset);
        break;
      case 1:
        unaff_R13 = (void *)(ulong)*(ushort *)((long)pvVar2 + data_offset);
        break;
      default:
        goto switchD_0010f050_caseD_2;
      case 3:
        unaff_R13 = (void *)(ulong)*(uint *)((long)pvVar2 + data_offset);
        break;
      case 7:
        unaff_R13 = *(void **)((long)pvVar2 + data_offset);
      }
      if (unaff_R13 == (void *)0x0) {
        return 1;
      }
    }
switchD_0010f050_caseD_2:
    pfVar9 = get_marshal_info(f,t);
    if (((pfVar9 != (field_marshal_info_conflict)0x0) && (pfVar9->type == FFSDropField)) &&
       (iVar7 = (*pfVar9->drop_row_func)(s->orig_data), iVar7 != 0)) {
      if (uVar14 < 8) {
        iVar7 = (*(code *)(&DAT_001390b0 + *(int *)(&DAT_001390b0 + uVar16 * 4)))();
        return iVar7;
      }
      return 1;
    }
    if ((f->recursive != 0) && (0 < (long)s->addr_list_cnt)) {
      lVar15 = -1;
      lVar17 = 0;
      do {
        if (*(void **)((long)&s->addr_list->addr + lVar17) == unaff_R13) {
          lVar15 = *(long *)((long)&s->addr_list->offset + lVar17);
        }
        lVar17 = lVar17 + 0x10;
      } while ((long)s->addr_list_cnt * 0x10 != lVar17);
      if (lVar15 != -1) {
        if (uVar14 < 8) {
          iVar7 = (*(code *)(&DAT_001390d0 + *(int *)(&DAT_001390d0 + uVar16 * 4)))
                            (f,&DAT_001390d0 + *(int *)(&DAT_001390d0 + uVar16 * 4),&DAT_001390d0,
                             buf->tmp_buffer);
          return iVar7;
        }
        return 1;
      }
    }
    pFVar12 = t->next;
    buf_00 = buf;
    sVar8 = determine_size(f,buf,parent_offset,pFVar12);
    if (sVar8 == 0) {
      if (uVar14 < 8) {
        iVar7 = (*(code *)(&DAT_00139110 + *(int *)(&DAT_00139110 + uVar16 * 4)))();
        return iVar7;
      }
      return 1;
    }
    if ((pfVar9 == (field_marshal_info_conflict)0x0) || (pfVar9->type != FFSSubsampleArrayField)) {
      data = extraout_RDX;
      if (s->copy_all == 0) {
        while( true ) {
          FVar1 = pFVar12->type;
          data = (FMFormat_conflict *)(ulong)FVar1;
          if (FVar1 != FMType_array) break;
          pFVar12 = pFVar12->next;
        }
        if (FVar1 == FMType_subformat) {
          data = f->field_subformats;
          if (data[pFVar12->field_index]->variant == 0) goto LAB_0010f79c;
        }
        else if (FVar1 == FMType_simple) {
LAB_0010f79c:
          sVar8 = add_data_iovec(s,buf_00,unaff_R13,sVar8,8);
          goto LAB_0010f5f8;
        }
      }
      if (s->no_leaf_copy == 0) {
        sVar8 = copy_data_to_tmp(s,buf,unaff_R13,sVar8,8,&local_98);
      }
      else {
        sVar8 = reserve_space_for_data_in_tmp(s,buf,data,sVar8,8,&local_98);
      }
    }
    else {
      local_90 = parent_offset;
      local_88 = unaff_R13;
      local_70 = pfVar9;
      sVar10 = determine_size(f,buf,parent_offset,pFVar12->next);
      auVar4._8_8_ = 0;
      auVar4._0_8_ = sVar10;
      auVar5._8_8_ = 0;
      auVar5._0_8_ = sVar8;
      local_80 = SUB168(auVar5 / auVar4,0);
      local_78 = pfVar9->ec;
      local_60 = sVar8;
      local_68 = allocate_tmp_space(s,buf,sVar8,8,&local_98);
      pcVar6 = local_78;
      local_58[0] = SUB164(auVar5 / auVar4,0);
      local_48 = local_88;
      local_40 = local_68 + (long)buf->tmp_buffer;
      local_38 = 0;
      local_50 = sVar10;
      cod_assoc_client_data(local_78,0x534d4450,(intptr_t)local_58);
      (*local_70->subsample_array_func)(pcVar6,s->orig_data,(int)local_80);
      set_dynamic_array_size(f,buf,local_90,t->next,local_38);
      piVar3 = s->iovec;
      iVar7 = s->iovcnt;
      piVar3[iVar7].iov_len = (long)local_38 * sVar10;
      piVar3[iVar7].iov_offset = local_98;
      piVar3[iVar7].iov_base = (void *)0x0;
      s->iovcnt = iVar7 + 1;
      lVar15 = (long)local_38 * sVar10 - local_60;
      s->output_len = s->output_len + lVar15;
      buf->tmp_buffer_in_use_size = buf->tmp_buffer_in_use_size + lVar15;
      sVar8 = local_68;
      unaff_R13 = local_88;
      parent_offset = local_90;
    }
LAB_0010f5f8:
    if (uVar14 < 8) {
      iVar7 = (*(code *)(&DAT_001390f0 + *(int *)(&DAT_001390f0 + uVar16 * 4)))
                        (sVar8,&DAT_001390f0 + *(int *)(&DAT_001390f0 + uVar16 * 4),&DAT_001390f0,
                         buf->tmp_buffer);
      return iVar7;
    }
    if (f->recursive != 0) {
      lVar17 = (long)s->addr_list_cnt;
      lVar15 = s->saved_offset_difference;
      if (s->addr_list_is_stack == 0) {
        if (s->malloc_addr_size == lVar17) {
          s->malloc_addr_size = lVar17 * 2;
          paVar11 = (addr_list_entry *)ffs_realloc(s->addr_list,lVar17 << 5);
          s->addr_list = paVar11;
        }
      }
      else if (s->addr_list_cnt == 100) {
        s->addr_list_is_stack = 0;
        s->malloc_addr_size = 200;
        paVar11 = (addr_list_entry *)ffs_malloc(0xc80);
        memcpy(paVar11,s->addr_list,0x640);
        s->addr_list = paVar11;
      }
      paVar11 = s->addr_list;
      iVar7 = s->addr_list_cnt;
      paVar11[iVar7].addr = unaff_R13;
      paVar11[iVar7].offset = sVar8 - lVar15;
      s->addr_list_cnt = iVar7 + 1;
    }
    for (pFVar12 = t->next; FVar1 = pFVar12->type, FVar1 == FMType_array; pFVar12 = pFVar12->next) {
    }
    if (FVar1 == FMType_subformat) {
      if (f->field_subformats[pFVar12->field_index]->variant != 0) goto LAB_0010f74b;
    }
    else if (FVar1 != FMType_simple) {
LAB_0010f74b:
      iVar7 = handle_subfield(buf,f,s,local_98,parent_offset,t->next);
      return iVar7;
    }
    break;
  case FMType_array:
    lVar15 = 1;
    do {
      lVar17 = lVar15;
      uVar16 = (ulong)t->static_size;
      if (uVar16 == 0) {
        iVar7 = f->field_list[t->control_field_index].field_size;
        uVar16 = 0;
        if (iVar7 - 1U < 8) {
          puVar13 = (ulong *)((long)buf->tmp_buffer +
                             (long)f->field_list[t->control_field_index].field_offset +
                             parent_offset);
          switch(iVar7) {
          case 1:
            uVar16 = (ulong)(byte)*puVar13;
            break;
          case 2:
            uVar16 = (ulong)(ushort)*puVar13;
            break;
          case 4:
            uVar16 = (ulong)(uint)*puVar13;
            break;
          case 8:
            uVar16 = *puVar13;
          }
        }
      }
      lVar15 = uVar16 * lVar17;
      t = t->next;
    } while (t->type == FMType_array);
    sVar8 = determine_size(f,buf,parent_offset,t);
    for (pFVar12 = t; FVar1 = pFVar12->type, FVar1 == FMType_array; pFVar12 = pFVar12->next) {
    }
    if (FVar1 == FMType_subformat) {
      if (f->field_subformats[pFVar12->field_index]->variant == 0) {
        return 1;
      }
    }
    else if (FVar1 == FMType_simple) {
      return 1;
    }
    if (lVar15 != 0) {
      lVar17 = uVar16 * lVar17;
      do {
        iVar7 = handle_subfield(buf,f,s,data_offset,parent_offset,t);
        if (iVar7 == 0) {
          return 0;
        }
        data_offset = data_offset + sVar8;
        lVar17 = lVar17 + -1;
      } while (lVar17 != 0);
    }
    break;
  case FMType_string:
    uVar14 = 0;
    if (f->pointer_size != 0) {
      for (; ((uint)f->pointer_size >> uVar14 & 1) == 0; uVar14 = uVar14 + 1) {
      }
    }
    iVar7 = (*(code *)(&DAT_00139060 + *(int *)(&DAT_00139060 + (ulong)uVar14 * 4)))();
    return iVar7;
  case FMType_subformat:
    iVar7 = handle_subfields(buf,f->field_subformats[t->field_index],s,data_offset);
    return iVar7;
  }
  return 1;
}

Assistant:

static int
handle_subfield(FFSBuffer buf, FMFormat f, estate s, size_t data_offset, size_t parent_offset, FMTypeDesc *t)
{

    switch (t->type) {
    case FMType_pointer:
    {
	struct _FMgetFieldStruct src_spec;
	size_t size, new_offset, tmp_data_loc;
	char *ptr_value;
	field_marshal_info marshal_info;

	memset(&src_spec, 0, sizeof(src_spec));
	src_spec.size = f->pointer_size;
	ptr_value = quick_get_pointer(&src_spec, (char*)buf->tmp_buffer + data_offset);
	if (ptr_value == NULL) return 1;

	/* customized marshalling */
	if ((marshal_info = get_marshal_info(f, t)) != NULL) {
	    if (marshal_info->type == FFSDropField) {
		if (marshal_info->drop_row_func(s->orig_data)) {
		    /* drop the value */
		    quick_put_ulong(&src_spec, 0,
				    (char*)buf->tmp_buffer + data_offset);
		    return 1;
		}
	    }
	}

	if (f->recursive) {
	    ssize_t previous_offset = search_addr_list(s, ptr_value);
	    if (previous_offset != (ssize_t)-1) {
		quick_put_ulong(&src_spec, previous_offset,
				(char*)buf->tmp_buffer + data_offset);
		return 1;
	    }
	}
	size = determine_size(f, buf, parent_offset, t->next);
	if (size == 0)  {
	    quick_put_ulong(&src_spec, 0,
			    (char*)buf->tmp_buffer + data_offset);
	    return 1;
	}
	if ((marshal_info == NULL) || (marshal_info->type != FFSSubsampleArrayField)) {
	    if (!s->copy_all && field_is_flat(f, t->next)) {
		/* leave data where it sits */
		new_offset = add_data_iovec(s, buf, ptr_value, size, 8);
	    } else {
		if (s->no_leaf_copy) {
		    /* this path only used for FFSencode_no_leaf_copy() */
		    new_offset = reserve_space_for_data_in_tmp(s, buf, ptr_value, size, 8, &tmp_data_loc);
		} else {
		    new_offset = copy_data_to_tmp(s, buf, ptr_value, size, 8, &tmp_data_loc);
		}
	    }
	} else {
	    /* can't leave data where it sits */
	    /* 1. allocate temporary space for the destination array
	       2. call function to fill destination with part of source
	       3. return value is number of elements copied
	       4. adjust size of temporary to reflect actual data copied
	    */
	    size_t element_size = determine_size(f, buf, parent_offset, t->next->next);
	    size_t element_count = size / element_size;
	    cod_exec_context ec = marshal_info->ec;
	    struct subsample_marshal_data smd;
	    new_offset = allocate_tmp_space(s, buf, size, 8, &tmp_data_loc);
	    smd.element_count = (int)element_count;
	    smd.element_size = element_size;
	    smd.src_ptr = ptr_value;
	    smd.dst_ptr = (char*)buf->tmp_buffer + new_offset;
	    smd.marshalled_count = 0;
#ifdef DO_DCG
	    cod_assoc_client_data(ec,  0x534d4450, (intptr_t)&smd);
#endif
	    marshal_info->subsample_array_func(ec, s->orig_data, (int)element_count);
	    /* fixup size */
	    set_dynamic_array_size(f, buf, parent_offset, t->next, 
				   smd.marshalled_count);
	    if (size != 0) {
		s->iovec[s->iovcnt].iov_len = smd.marshalled_count * element_size;
		s->iovec[s->iovcnt].iov_offset = tmp_data_loc;
		s->iovec[s->iovcnt].iov_base = NULL;
		s->iovcnt++;
	    }
	    s->output_len -= (size - (smd.marshalled_count *element_size));
	    buf->tmp_buffer_in_use_size -= (size - (smd.marshalled_count *element_size));
	}
	quick_put_ulong(&src_spec, new_offset - s->saved_offset_difference, 
			(char*)buf->tmp_buffer + data_offset);
	if (f->recursive) {
	    add_to_addr_list(s, ptr_value, new_offset - s->saved_offset_difference);
	}
	if (field_is_flat(f, t->next)) return 1;
	return handle_subfield(buf, f, s, tmp_data_loc, parent_offset, t->next);
    }
    case FMType_string:
    {
	struct _FMgetFieldStruct src_spec;
	char *ptr_value;
	size_t size, str_offset;
	memset(&src_spec, 0, sizeof(src_spec));
	src_spec.size = f->pointer_size;
	ptr_value = quick_get_pointer(&src_spec, (char*)buf->tmp_buffer + data_offset);
	if (ptr_value == NULL) return 1;
	size = strlen(ptr_value) + 1;
	if (!s->copy_all) {
	    /* leave data where it sits */
	    str_offset = add_data_iovec(s, buf, ptr_value, size, 1);
	} else {
	    str_offset = copy_data_to_tmp(s, buf, ptr_value, size, 1, NULL);
	    if (str_offset == (size_t) -1) return 0;
	}
	quick_put_ulong(&src_spec, str_offset - s->saved_offset_difference,
			(char*)buf->tmp_buffer + data_offset);
	break;
    }
    case FMType_array:
    {
	size_t elements = 1, i;
	size_t element_size;
	FMTypeDesc *next = t;
	while (next->type == FMType_array) {
	    if (next->static_size == 0) {
		struct _FMgetFieldStruct src_spec;
		int field = next->control_field_index;
		memset(&src_spec, 0, sizeof(src_spec));
		src_spec.size = f->field_list[field].field_size;
		src_spec.offset = f->field_list[field].field_offset;
		size_t tmp = quick_get_ulong(&src_spec, (char*)buf->tmp_buffer + parent_offset);
		elements = elements * tmp;
	    } else {
		elements = elements * next->static_size;
	    }
	    next = next->next;
	}
	element_size = determine_size(f, buf, parent_offset, next);
	if (field_is_flat(f, next)) return 1;
	for (i = 0; i < elements ; i++) {
	    size_t element_offset = data_offset + i * element_size;
	    if (!handle_subfield(buf, f, s, element_offset, parent_offset, next)) return 0;
	}
	break;
    }
    case FMType_subformat:
    {
	int field_index = t->field_index;
	FMFormat subformat = f->field_subformats[field_index];
	return handle_subfields(buf, subformat, s, data_offset);
    }
    default:
	assert(0);
    }
    return 1;
}